

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_ineighbor_alltoallw_
               (void *sendbuf,int *sendcounts,MPIABI_Fint *sdispls,MPIABI_Fint *sendtypes,
               void *recvbuf,int *recvcounts,MPIABI_Fint *rdispls,MPIABI_Fint *recvtypes,
               MPIABI_Fint *comm,MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  mpi_ineighbor_alltoallw_();
  return;
}

Assistant:

void mpiabi_ineighbor_alltoallw_(
  const void * sendbuf,
  const int * sendcounts,
  const MPIABI_Fint * sdispls,
  const MPIABI_Fint * sendtypes,
  void * recvbuf,
  const int * recvcounts,
  const MPIABI_Fint * rdispls,
  const MPIABI_Fint * recvtypes,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_ineighbor_alltoallw_(
    sendbuf,
    sendcounts,
    sdispls,
    sendtypes,
    recvbuf,
    recvcounts,
    rdispls,
    recvtypes,
    comm,
    request,
    ierror
  );
}